

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdKelvinFenceOffset::is_valid_val(MthdKelvinFenceOffset *this)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = pgraph_3d_class(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (iVar2 < 6) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.chipset == 0x20) {
      bVar3 = (uVar1 & 0xfffff003) == 0;
    }
    else {
      bVar3 = (uVar1 & 0xfffff00f) == 0;
    }
  }
  else {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
    if ((uVar1 & 0xf000000) < 0x4000001) {
      bVar3 = (uVar1 & 0xf0fff00f) == 0;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool is_valid_val() override {
		if (pgraph_3d_class(&exp) < PGRAPH_3D_CURIE) {
			if (chipset.chipset == 0x20)
				return !(val & ~0xffc);
			else
				return !(val & ~0xff0);
		} else {
			int unk = extr(val, 24, 4);
			if (unk > 4)
				return false;
			if (val & ~0x0f000ff0)
				return false;
			return true;
		}
	}